

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O3

ssh_hash * blake2b_new_inner(uint hashlen)

{
  void *pvVar1;
  
  if (hashlen < 0x41) {
    pvVar1 = safemalloc(1,0x108,0);
    *(ssh_hashalg **)((long)pvVar1 + 0xf8) = &ssh_blake2b;
    *(uint *)((long)pvVar1 + 0x40) = hashlen;
    *(code **)((long)pvVar1 + 0xe0) = blake2b_write;
    *(undefined8 *)((long)pvVar1 + 0xe8) = 0;
    *(long *)((long)pvVar1 + 0xf0) = (long)pvVar1 + 0xe0;
    *(long *)((long)pvVar1 + 0x100) = (long)pvVar1 + 0xe0;
    return (ssh_hash *)((long)pvVar1 + 0xf8);
  }
  __assert_fail("hashlen <= ssh_blake2b.hlen",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blake2.c",
                0x78,"ssh_hash *blake2b_new_inner(unsigned int)");
}

Assistant:

static ssh_hash *blake2b_new_inner(unsigned hashlen)
{
    assert(hashlen <= ssh_blake2b.hlen);

    blake2b *s = snew(blake2b);
    s->hash.vt = &ssh_blake2b;
    s->hashlen = hashlen;
    BinarySink_INIT(s, blake2b_write);
    BinarySink_DELEGATE_INIT(&s->hash, s);
    return &s->hash;
}